

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asFile
          (InMemoryDirectory *this,Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,
          EntryImpl *entry,WriteMode mode)

{
  int iVar1;
  Mutex *this_00;
  undefined8 *puVar2;
  size_t sVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined4 in_register_0000000c;
  long lVar6;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *extraout_RDX_01;
  File *extraout_RDX_02;
  File *extraout_RDX_03;
  File *extraout_RDX_04;
  ulong in_R8;
  String *pSVar8;
  _func_int **pp_Var9;
  PathPtr path;
  Maybe<kj::Own<const_kj::File>_> MVar10;
  Path newPath;
  Fault f;
  Path local_58;
  Fault local_40;
  long *local_38;
  File *pFVar7;
  
  lVar6 = CONCAT44(in_register_0000000c,mode);
  iVar1 = *(int *)(lVar6 + 0x18);
  if (iVar1 == 0) {
    if ((in_R8 & 1) == 0) {
      local_40.exception = (Exception *)0x0;
      local_58.parts.ptr = (String *)0x0;
      local_58.parts.size_ = 0;
      _::Debug::Fault::init
                (&local_40,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                );
      _::Debug::Fault::fatal(&local_40);
    }
    puVar2 = (undefined8 *)(entry->name).content.size_;
    uVar5 = (*(code *)**(undefined8 **)*puVar2)();
    puVar2[7] = uVar5;
    newInMemoryFile((kj *)&local_40,*(Clock **)(entry->name).content.size_);
    plVar4 = local_38;
    local_38 = (long *)0x0;
    if (((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
          *)(lVar6 + 0x18))->tag != 0) {
      OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
      ::destroy((OneOf<kj::(anonymous_namespace)::InMemoryDirectory::FileNode,_kj::(anonymous_namespace)::InMemoryDirectory::DirectoryNode,_kj::(anonymous_namespace)::InMemoryDirectory::SymlinkNode>
                 *)(lVar6 + 0x18));
    }
    *(Exception **)(lVar6 + 0x20) = local_40.exception;
    *(long **)(lVar6 + 0x28) = plVar4;
    *(undefined4 *)(lVar6 + 0x18) = 1;
    (**(code **)(*plVar4 + 0x28))(&local_58,plVar4);
    pp_Var9 = (_func_int **)local_58.parts.size_;
    if ((_func_int **)local_58.parts.size_ == (_func_int **)0x0) {
      pSVar8 = (String *)0x0;
      pp_Var9 = (_func_int **)0x0;
    }
    else {
      local_58.parts.size_ = 0;
      pSVar8 = local_58.parts.ptr;
    }
    sVar3 = local_58.parts.size_;
    pFVar7 = extraout_RDX_01;
    if ((_func_int **)local_58.parts.size_ != (_func_int **)0x0) {
      local_58.parts.size_ = 0;
      (**(code **)((local_58.parts.ptr)->content).ptr)
                (local_58.parts.ptr,sVar3 + *(long *)(*(_func_int **)sVar3 + -0x10));
      pFVar7 = extraout_RDX_04;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar8
    ;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var9;
  }
  else if (iVar1 == 3) {
    SymlinkNode::parse(&local_58,(SymlinkNode *)(lVar6 + 0x20));
    this_00 = (Mutex *)(entry->name).content.ptr;
    if (this_00 != (Mutex *)0x0) {
      _::Mutex::unlock(this_00,EXCLUSIVE);
    }
    (entry->name).content.ptr = (char *)0x0;
    (entry->name).content.size_ = 0;
    path.parts.size_ = (size_t)local_58.parts.ptr;
    path.parts.ptr = (String *)lock;
    MVar10 = tryOpenFile(this,path,(WriteMode)local_58.parts.size_);
    sVar3 = local_58.parts.size_;
    pSVar8 = local_58.parts.ptr;
    pFVar7 = MVar10.ptr.ptr;
    if (local_58.parts.ptr != (String *)0x0) {
      local_58.parts.ptr = (String *)0x0;
      local_58.parts.size_ = 0;
      (**(local_58.parts.disposer)->_vptr_ArrayDisposer)
                (local_58.parts.disposer,pSVar8,0x18,sVar3,sVar3,
                 ArrayDisposer::Dispose_<kj::String,_false>::destruct);
      pFVar7 = extraout_RDX_00;
    }
  }
  else if (iVar1 == 1) {
    (**(code **)(**(long **)(lVar6 + 0x28) + 0x28))(&local_58);
    pp_Var9 = (_func_int **)local_58.parts.size_;
    if ((_func_int **)local_58.parts.size_ == (_func_int **)0x0) {
      pp_Var9 = (_func_int **)0x0;
      pSVar8 = (String *)0x0;
    }
    else {
      local_58.parts.size_ = 0;
      pSVar8 = local_58.parts.ptr;
    }
    sVar3 = local_58.parts.size_;
    pFVar7 = extraout_RDX;
    if ((_func_int **)local_58.parts.size_ != (_func_int **)0x0) {
      local_58.parts.size_ = 0;
      (**(code **)((local_58.parts.ptr)->content).ptr)
                (local_58.parts.ptr,sVar3 + *(long *)(*(_func_int **)sVar3 + -0x10));
      pFVar7 = extraout_RDX_03;
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)pSVar8
    ;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = pp_Var9;
  }
  else {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
              ((Fault *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x664,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    _::Debug::Fault::~Fault((Fault *)&local_58);
    pFVar7 = extraout_RDX_02;
  }
  MVar10.ptr.ptr = pFVar7;
  MVar10.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar10.ptr;
}

Assistant:

Maybe<Own<const File>> asFile(kj::Locked<Impl>& lock, EntryImpl& entry, WriteMode mode) const {
    if (entry.node.is<FileNode>()) {
      return entry.node.get<FileNode>().file->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      // CREATE_PARENT doesn't apply to creating the parents of a symlink target. However, the
      // target itself can still be created.
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenFile(newPath, mode - WriteMode::CREATE_PARENT);
    } else if (entry.node == nullptr) {
      KJ_ASSERT(has(mode, WriteMode::CREATE));
      lock->modified();
      return entry.init(FileNode { newInMemoryFile(lock->clock) });
    } else {
      KJ_FAIL_REQUIRE("not a file") { return nullptr; }
    }
  }